

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

path * __thiscall
mdsplit::mdsplitter::relative_path
          (path *__return_storage_ptr__,mdsplitter *this,path *path,path *base)

{
  bool bVar1;
  ulong uVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  path local_228;
  path local_200;
  path local_1d8;
  path local_1b0;
  path local_188;
  path local_160;
  path local_138;
  path local_110;
  undefined1 local_e1;
  path local_e0;
  undefined1 local_b5;
  undefined4 local_b4;
  undefined1 local_b0 [3];
  bool is_in_project_dir;
  undefined1 local_88 [8];
  string ext;
  bool is_docs_dir;
  undefined1 local_50 [7];
  bool is_in_docs_dir;
  path base_dir;
  path *base_local;
  path *path_local;
  mdsplitter *this_local;
  path *r;
  
  base_dir._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )base;
  bVar1 = std::filesystem::is_directory(base);
  if (bVar1) {
    std::filesystem::__cxx11::path::path
              ((path *)local_50,
               (path *)base_dir._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl);
  }
  else {
    std::filesystem::__cxx11::path::parent_path();
  }
  bVar1 = is_subdirectory(this,path,&this->output_dir_);
  ext.field_2._M_local_buf[0xb] = std::filesystem::__cxx11::operator==(path,&this->output_dir_);
  if ((!bVar1) || ((bool)ext.field_2._M_local_buf[0xb])) {
    std::filesystem::current_path_abi_cxx11_();
    bVar1 = is_subdirectory(this,path,&local_e0);
    std::filesystem::__cxx11::path::~path(&local_e0);
    local_b5 = bVar1;
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_e1 = 0;
        std::filesystem::__cxx11::path::path(__return_storage_ptr__);
        bVar1 = is_external(&this->repository_);
        if (!bVar1) {
          std::filesystem::__cxx11::path::operator/=
                    (__return_storage_ptr__,(char (*) [19])"https://github.com");
        }
        std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,&this->repository_);
        std::filesystem::__cxx11::path::operator/=
                  (__return_storage_ptr__,(char (*) [12])"blob/master");
        std::filesystem::current_path_abi_cxx11_();
        std::filesystem::relative(&local_110,path);
        std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,&local_110);
        std::filesystem::__cxx11::path::~path(&local_110);
        std::filesystem::__cxx11::path::~path(&local_138);
        local_b4 = 1;
        local_e1 = 1;
      }
      else {
        std::filesystem::current_path_abi_cxx11_();
        std::filesystem::relative(&local_160,path);
        pbVar3 = std::filesystem::__cxx11::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_160);
        poVar4 = std::operator<<((ostream *)pbVar3,
                                 " is outside the output directory but you have not provided a repository to mdsplit. This will generate a broken link."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::filesystem::__cxx11::path::~path(&local_160);
        std::filesystem::__cxx11::path::~path(&local_188);
        std::filesystem::current_path_abi_cxx11_();
        std::filesystem::relative(__return_storage_ptr__,path);
        std::filesystem::__cxx11::path::~path(&local_1b0);
        local_b4 = 1;
      }
    }
    else {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(&local_1d8,path);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_1d8);
      poVar4 = std::operator<<((ostream *)pbVar3,
                               " is outside the project directory. There\'s no way to generate a relative link that will work elsewhere. This will generate a broken link in your documentation."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::filesystem::__cxx11::path::~path(&local_1d8);
      std::filesystem::__cxx11::path::~path(&local_200);
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(__return_storage_ptr__,path);
      std::filesystem::__cxx11::path::~path(&local_228);
      local_b4 = 1;
    }
  }
  else {
    ext.field_2._M_local_buf[10] = '\0';
    std::filesystem::relative(__return_storage_ptr__,path);
    std::filesystem::__cxx11::path::extension((path *)local_b0,__return_storage_ptr__);
    std::filesystem::__cxx11::path::string((string *)local_88,(path *)local_b0);
    std::filesystem::__cxx11::path::~path((path *)local_b0);
    ext.field_2._M_local_buf[10] = '\x01';
    local_b4 = 1;
    std::__cxx11::string::~string((string *)local_88);
    if ((ext.field_2._M_local_buf[10] & 1U) == 0) {
      std::filesystem::__cxx11::path::~path(__return_storage_ptr__);
    }
  }
  std::filesystem::__cxx11::path::~path((path *)local_50);
  return __return_storage_ptr__;
}

Assistant:

fs::path mdsplitter::relative_path(const fs::path &path,
                                       const fs::path &base) {
        fs::path base_dir = fs::is_directory(base) ? base : base.parent_path();
        bool is_in_docs_dir = is_subdirectory(path, output_dir_);
        bool is_docs_dir = path == this->output_dir_;
        if (is_in_docs_dir && !is_docs_dir) {
            fs::path r = fs::relative(path, base_dir);
            std::string ext = r.extension().string();
            // GitHub does not convert ".md#anchor" links automatically
            /*
            bool is_anchor_inside_docs = ext.rfind(".md#", 0) == 0;
            if (is_anchor_inside_docs) {
                ext.replace(0, 4, ".html#");
                r = r.parent_path() / r.stem();
                r += ext;
            }
             */
            return r;
        } else {
            bool is_in_project_dir = is_subdirectory(path, fs::current_path());
            if (is_in_project_dir) {
                if (!repository_.empty()) {
                    fs::path url;
                    if (!is_external(repository_)) {
                        url /= "https://github.com";
                    }
                    url /= repository_;
                    url /= "blob/master";
                    url /= fs::relative(path, fs::current_path());
                    return url;
                } else {
                    std::cerr << fs::relative(path, fs::current_path())
                              << " is outside the output directory but you "
                                 "have not provided a repository to mdsplit. "
                                 "This will generate a broken link."
                              << std::endl;
                    return fs::relative(path, fs::current_path());
                }
            } else {
                std::cerr
                    << fs::relative(path, fs::current_path())
                    << " is outside the project directory. There's no way to "
                       "generate a relative link that will work elsewhere. "
                       "This will generate a broken link in your documentation."
                    << std::endl;
                return fs::relative(path, fs::current_path());
            }
        }
    }